

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_get(Table *t,TValue *key)

{
  byte bVar1;
  ushort uVar2;
  TString *key_00;
  TString *pTVar3;
  uint __line;
  int iVar4;
  lua_Integer in_RAX;
  TValue *pTVar5;
  ushort uVar6;
  Node *n;
  char *pcVar7;
  lua_Integer k;
  
  uVar2 = key->tt_;
  uVar6 = uVar2 & 0x7f;
  if ((uVar2 & 0x7f) == 0) {
    return &luaO_nilobject_;
  }
  if (uVar6 == 3) {
    k = in_RAX;
    iVar4 = luaV_tointeger(key,&k,F2Ieq);
    if (iVar4 != 0) {
      pTVar5 = luaH_getint(t,k);
      return pTVar5;
    }
  }
  else {
    if (uVar6 == 0x13) {
      if (uVar2 == 0x13) {
        pTVar5 = luaH_getint(t,(key->value_).i);
        return pTVar5;
      }
      __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,699,"const TValue *luaH_get(Table *, const TValue *)");
    }
    if (uVar6 == 4) {
      if ((uVar2 & 0xf) == 4) {
        key_00 = (TString *)(key->value_).gc;
        if ((key_00->tt & 0xf) == 4) {
          if (key_00->tt == 4) {
            n = t->node + (t->hmask & key_00->hash);
            if ((n->i_key).nk.tt_ != 0x8004) {
LAB_00120862:
              if ((n->i_key).nk.next == 0) {
                return &luaO_nilobject_;
              }
              pTVar5 = luaH_getshortstr_continue(key_00,n);
              return pTVar5;
            }
            pTVar3 = (TString *)(n->i_key).nk.value_.gc;
            bVar1 = pTVar3->tt;
            if ((bVar1 & 0xf) == 4) {
              if (bVar1 == 4) {
                if (pTVar3 == key_00) {
                  return &n->i_val;
                }
                goto LAB_00120862;
              }
              pcVar7 = 
              "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
              ;
            }
            else {
              pcVar7 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
            }
            __line = 0x5c;
          }
          else {
            pcVar7 = "key->tt == ((4) | ((0) << 4))";
            __line = 0x5a;
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                        ,__line,"const TValue *luaH_getshortstr(Table *, TString *)");
        }
        pcVar7 = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        pcVar7 = "(((((((key))->tt_)) & 0x0F)) == (4))";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2ba,"const TValue *luaH_get(Table *, const TValue *)");
    }
  }
  pTVar5 = getgeneric(t,key);
  return pTVar5;
}

Assistant:

const TValue *luaH_get(Table *t, const TValue *key) {
#if 1
  switch (ttype(key)) {
    case LUA_TSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_TNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TNUMFLT: {
      lua_Integer k;
      if (luaV_tointeger(key, &k, 0)) /* index is int? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key);
  }
#else
  int tt = ttype(key);
  if (RAVI_LIKELY(tt == LUA_TNUMINT))
    return luaH_getint(t, ivalue(key));
  else if (tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, tsvalue(key));
  else if (tt == LUA_TNIL)
    return luaO_nilobject;
  else if (tt == LUA_TNUMFLT) {
    lua_Integer k;
    if (luaV_tointeger(key, &k, 0)) /* index is int? */
      return luaH_getint(t, k);     /* use specialized version */
    /* else... */
    return getgeneric(t, key);
  } /* FALLTHROUGH */
  else {
    return getgeneric(t, key);
  }
#endif
}